

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftType.cpp
# Opt level: O0

void __thiscall ShiftType::ShiftType(ShiftType *this,string *id,int *min,int *max)

{
  int *max_local;
  int *min_local;
  string *id_local;
  ShiftType *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->forbiddenSucceedingShiftTypes);
  std::__cxx11::string::operator=((string *)this,(string *)id);
  this->minimumNumberOfConsecutiveAssignments = *min;
  this->maximumNumberOfConsecutiveAssignments = *max;
  return;
}

Assistant:

ShiftType::ShiftType(const string &id, const int &min, const int &max) {
    this->id = id;
    minimumNumberOfConsecutiveAssignments = min;
    maximumNumberOfConsecutiveAssignments = max;
}